

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::OP_ProfiledLdThis
          (InterpreterStackFrame *this,Var thisVar,int moduleID,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DynamicProfileInfo *this_00;
  undefined4 *puVar4;
  RecyclableObject *this_01;
  Var pvVar5;
  char *message;
  ThisType thisType;
  char *error;
  uint lineNumber;
  Type typeId;
  
  this_00 = FunctionBody::GetDynamicProfileInfo(*(FunctionBody **)(this + 0x88));
  if (thisVar == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_009a0994;
    *puVar4 = 0;
LAB_009a078c:
    this_01 = UnsafeVarTo<Js::RecyclableObject>(thisVar);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_009a0994;
      *puVar4 = 0;
    }
    typeId = ((this_01->type).ptr)->typeId;
    if (0x57 < (int)typeId) {
      BVar3 = RecyclableObject::IsExternal(this_01);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_009a0994;
        goto LAB_009a085d;
      }
    }
  }
  else if (((ulong)thisVar & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)thisVar & 0xffff000000000000) != 0x1000000000000) {
    typeId = TypeIds_FirstNumberType;
    if ((((ulong)thisVar & 0xffff000000000000) != 0x1000000000000) &&
       (typeId = TypeIds_Number, (ulong)thisVar >> 0x32 == 0)) goto LAB_009a078c;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_009a0994;
    typeId = TypeIds_FirstNumberType;
LAB_009a085d:
    *puVar4 = 0;
  }
  bVar2 = JavascriptOperators::IsThisSelf(typeId);
  if (!bVar2) {
    thisVar = JavascriptOperators::OP_GetThis
                        (thisVar,moduleID,&scriptContext->super_ScriptContextInfo);
    thisType = ThisType_Mapped;
    goto LAB_009a097d;
  }
  if (typeId == TypeIds_LastTrueJavascriptObjectType) {
    pvVar5 = JavascriptOperators::GetThisFromModuleRoot(thisVar);
    if (pvVar5 != thisVar) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      error = 
      "(typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar)"
      ;
      message = 
      "typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar"
      ;
      lineNumber = 0x15fa;
LAB_009a0961:
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,lineNumber,error,message);
      if (!bVar2) {
LAB_009a0994:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else if (typeId == TypeIds_GlobalObject) {
    pvVar5 = GlobalObject::ToThis((GlobalObject *)thisVar);
    if (pvVar5 != thisVar) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      error = 
      "(typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar)";
      message = 
      "typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar";
      lineNumber = 0x15f9;
      goto LAB_009a0961;
    }
  }
  thisType = ThisType_Simple;
LAB_009a097d:
  DynamicProfileInfo::RecordThisInfo(this_00,thisVar,thisType);
  return thisVar;
}

Assistant:

Var InterpreterStackFrame::OP_ProfiledLdThis(Var thisVar, int moduleID, ScriptContext *scriptContext)
    {
        FunctionBody * functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        TypeId typeId = JavascriptOperators::GetTypeId(thisVar);

        if (JavascriptOperators::IsThisSelf(typeId))
        {
            Assert(typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar);
            Assert(typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar);

            // Record the fact that we saw a trivial LdThis.
            dynamicProfileInfo->RecordThisInfo(thisVar, ThisType_Simple);

            return thisVar;
        }

        thisVar = JavascriptOperators::OP_GetThis(thisVar, moduleID, scriptContext);

        // Record the fact that we saw a LdThis that had to map its source to something else, or at least
        // forced us to call a helper, e.g., a FastDOM object with an unrecognized type ID.
        dynamicProfileInfo->RecordThisInfo(thisVar, ThisType_Mapped);

        return thisVar;
    }